

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverCore.c
# Opt level: O3

int Msat_SolverSolve(Msat_Solver_t *p,Msat_IntVec_t *vAssumps,int nBackTrackLimit,int nTimeLimit)

{
  int iVar1;
  uint uVar2;
  Msat_Type_t MVar3;
  int *piVar4;
  Msat_Clause_t *pMVar5;
  long lVar6;
  ulong uVar7;
  timespec ts;
  Msat_SearchParams_t Params;
  double local_70;
  double local_68;
  long local_60;
  timespec local_58;
  Msat_SearchParams_t local_48;
  
  local_48.dVarDecay = 0.95;
  local_48.dClaDecay = 0.999;
  iVar1 = clock_gettime(3,&local_58);
  if (iVar1 < 0) {
    local_60 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    local_60 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  if (vAssumps != (Msat_IntVec_t *)0x0) {
    iVar1 = Msat_IntVecReadSize(p->vTrailLim);
    if (iVar1 != 0) {
      __assert_fail("Msat_IntVecReadSize(p->vTrailLim) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatSolverCore.c"
                    ,0x98,"int Msat_SolverSolve(Msat_Solver_t *, Msat_IntVec_t *, int, int)");
    }
    uVar2 = Msat_IntVecReadSize(vAssumps);
    piVar4 = Msat_IntVecReadArray(vAssumps);
    if (0 < (int)uVar2) {
      uVar7 = 0;
      do {
        iVar1 = Msat_SolverAssume(p,piVar4[uVar7]);
        if ((iVar1 == 0) || (pMVar5 = Msat_SolverPropagate(p), pMVar5 != (Msat_Clause_t *)0x0)) {
          Msat_QueueClear(p->pQueue);
          Msat_SolverCancelUntil(p,0);
          return -1;
        }
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
    }
  }
  iVar1 = Msat_SolverReadDecisionLevel(p);
  p->nLevelRoot = iVar1;
  iVar1 = Msat_ClauseVecReadSize(p->vClauses);
  p->nClausesInit = iVar1;
  iVar1 = Msat_ClauseVecReadSize(p->vClauses);
  local_68 = (double)(iVar1 / 3);
  p->nBackTracks = (int)(p->Stats).nConflicts;
  local_70 = 100.0;
  do {
    if (p->fVerbose != 0) {
      printf("Solving -- conflicts=%d   learnts=%d   progress=%.4f %%\n",
             SUB84(p->dProgress * 100.0,0),(ulong)(uint)(int)local_70,(ulong)(uint)(int)local_68);
    }
    MVar3 = Msat_SolverSearch(p,(int)local_70,(int)local_68,nBackTrackLimit,&local_48);
    local_70 = local_70 * 1.5;
    local_68 = local_68 * 1.1;
    if ((0 < nBackTrackLimit) && (nBackTrackLimit < (int)(p->Stats).nConflicts - p->nBackTracks))
    break;
    if (0 < nTimeLimit) {
      iVar1 = clock_gettime(3,&local_58);
      if (iVar1 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
      }
      if ((long)((ulong)(uint)nTimeLimit * 1000000) <= lVar6 + local_60) break;
    }
  } while (MVar3 == MSAT_UNKNOWN);
  Msat_SolverCancelUntil(p,0);
  p->nBackTracks = (int)(p->Stats).nConflicts - p->nBackTracks;
  return MVar3;
}

Assistant:

int  Msat_SolverSolve( Msat_Solver_t * p, Msat_IntVec_t * vAssumps, int nBackTrackLimit, int nTimeLimit )
{
    Msat_SearchParams_t Params = { 0.95, 0.999 };
    double nConflictsLimit, nLearnedLimit;
    Msat_Type_t Status;
    abctime timeStart = Abc_Clock();

//    p->pFreq = ABC_ALLOC( int, p->nVarsAlloc );
//    memset( p->pFreq, 0, sizeof(int) * p->nVarsAlloc );
 
    if ( vAssumps )
    {
        int * pAssumps, nAssumps, i;

        assert( Msat_IntVecReadSize(p->vTrailLim) == 0 );

        nAssumps = Msat_IntVecReadSize( vAssumps );
        pAssumps = Msat_IntVecReadArray( vAssumps );
        for ( i = 0; i < nAssumps; i++ )
        {
            if ( !Msat_SolverAssume(p, pAssumps[i]) || Msat_SolverPropagate(p) )
            {
                Msat_QueueClear( p->pQueue );
                Msat_SolverCancelUntil( p, 0 );
                return MSAT_FALSE;
            }
        }
    }
    p->nLevelRoot   = Msat_SolverReadDecisionLevel(p);
    p->nClausesInit = Msat_ClauseVecReadSize( p->vClauses );    
    nConflictsLimit = 100;
    nLearnedLimit   = Msat_ClauseVecReadSize(p->vClauses) / 3;
    Status = MSAT_UNKNOWN;
    p->nBackTracks = (int)p->Stats.nConflicts;
    while ( Status == MSAT_UNKNOWN )
    {
        if ( p->fVerbose )
            printf("Solving -- conflicts=%d   learnts=%d   progress=%.4f %%\n", 
                (int)nConflictsLimit, (int)nLearnedLimit, p->dProgress*100);
        Status = Msat_SolverSearch( p, (int)nConflictsLimit, (int)nLearnedLimit, nBackTrackLimit, &Params );
        nConflictsLimit *= 1.5;
        nLearnedLimit   *= 1.1;
        // if the limit on the number of backtracks is given, quit the restart loop
        if ( nBackTrackLimit > 0 && (int)p->Stats.nConflicts - p->nBackTracks > nBackTrackLimit )
            break;
        // if the runtime limit is exceeded, quit the restart loop
        if ( nTimeLimit > 0 && Abc_Clock() - timeStart >= nTimeLimit * CLOCKS_PER_SEC )
            break;
    }
    Msat_SolverCancelUntil( p, 0 );
    p->nBackTracks = (int)p->Stats.nConflicts - p->nBackTracks;
/*
    ABC_PRT( "True solver runtime", Abc_Clock() - timeStart );
    // print the statistics
    {
        int i, Counter = 0;
        for ( i = 0; i < p->nVars; i++ )
            if ( p->pFreq[i] > 0 )
            {
                printf( "%d ", p->pFreq[i] );
                Counter++;
            }
        if ( Counter )
            printf( "\n" );
        printf( "Total = %d. Used = %d.  Decisions = %d. Imps = %d. Conflicts = %d. ", p->nVars, Counter, (int)p->Stats.nDecisions, (int)p->Stats.nPropagations, (int)p->Stats.nConflicts );
        ABC_PRT( "Time", Abc_Clock() - timeStart );
    }
*/
    return Status;
}